

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

HttpRequest * parse_str_to_req(char *req_string)

{
  int iVar1;
  HttpRequest *res_req;
  char **__ptr;
  char req [1000];
  uint uStack_41c;
  char local_3f8 [1000];
  
  if (req_string != (char *)0x0) {
    strcpy(local_3f8,req_string);
    res_req = (HttpRequest *)malloc(0x2938);
    res_req->method = ~GET;
    memset(res_req->url,0,0x200);
    *(ulong *)&res_req->field_0x204 = (ulong)uStack_41c;
    *(undefined8 *)((long)&(res_req->headers).base.buckets + 4) = 0;
    *(undefined8 *)&(res_req->headers).base.nnodes = 0;
    *(undefined8 *)((long)&(res_req->headers).ref + 4) = 0;
    *(undefined4 *)((long)&(res_req->headers).tmp + 4) = 0;
    memset(res_req->data,0,10000);
    __ptr = _break_into_lines(local_3f8,res_req);
    if (__ptr != (char **)0x0) {
      iVar1 = _parse_declaration(res_req,*__ptr);
      if ((iVar1 != -1) && (iVar1 = _parse_headers(res_req,__ptr + 1), iVar1 != -1)) {
        return res_req;
      }
      free(__ptr);
    }
    free(res_req);
  }
  return (HttpRequest *)0x0;
}

Assistant:

HttpRequest *parse_str_to_req(char *req_string) {
    if (req_string == NULL)
        return NULL;
    char req[MAX_REQUEST_LENGTH];
    strcpy(req, req_string);
    HttpRequest *res = malloc(sizeof(HttpRequest));
    *res = (HttpRequest) {.method = -1, .url = "\0", .host = "\0", .data = "\0"};
    int status;
    char **lines = _break_into_lines(req, res);
    if (lines == NULL) {
        free(res);
        return NULL;
    }
    status = _parse_declaration(res, lines[0]);
    if (status == -1) goto err_parse_out;

    status = _parse_headers(res, lines + 1);
    if (status == -1) goto err_parse_out;

    return res;

    err_parse_out:
    {
        free(lines);
        free(res);
        return NULL;
    }
}